

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToSetAndContinueInst<false>::Exec
          (SyncToSetAndContinueInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  uint uVar3;
  bool bVar4;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar3 = *inputOffset;
  if (uVar3 < inputLength) {
    do {
      CVar2 = input[uVar3];
      if ((ushort)CVar2 < 0x100) {
        bVar4 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
                 ((ushort)CVar2 & 0x1f) & 1) != 0;
LAB_00f02a8b:
        if (bVar4 != false) break;
      }
      else if ((this->super_SetMixin<false>).set.root != (CharSetNode *)0x0) {
        bVar4 = RuntimeCharSet<char16_t>::Get_helper
                          (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
        goto LAB_00f02a8b;
      }
      if (matcher->stats != (Type)0x0) {
        puVar1 = &matcher->stats->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      uVar3 = *inputOffset + 1;
      *inputOffset = uVar3;
    } while (uVar3 < inputLength);
  }
  *matchStart = *inputOffset;
  *instPointer = *instPointer + 0x29;
  return false;
}

Assistant:

inline bool SyncToSetAndContinueInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif

        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }